

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O3

string * __thiscall
Assimp::ObjExporter::GetMaterialName_abi_cxx11_
          (string *__return_storage_ptr__,ObjExporter *this,uint index)

{
  char *pcVar1;
  aiMaterial *pMat;
  byte bVar2;
  long lVar3;
  aiReturn aVar4;
  size_t sVar5;
  long *plVar6;
  uint uVar7;
  size_type *psVar8;
  char *pcVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  char number [13];
  aiString s;
  char local_45d [13];
  long *local_450 [2];
  long local_440 [2];
  aiString local_42c;
  
  pMat = this->pScene->mMaterials[index];
  if (pMat == (aiMaterial *)0x0) {
    if (GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_ == '\0') {
      GetMaterialName_abi_cxx11_();
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_._M_dataplus._M_p,
               GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_._M_dataplus._M_p +
               GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_._M_string_length);
  }
  else {
    local_42c.length = 0;
    local_42c.data[0] = '\0';
    memset(local_42c.data + 1,0x1b,0x3ff);
    aVar4 = aiGetMaterialString(pMat,"?mat.name",0,0,&local_42c);
    if (aVar4 == aiReturn_SUCCESS) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_42c.data,local_42c.data + local_42c.length);
    }
    else {
      if ((int)index < 0) {
        pcVar9 = local_45d + 1;
        local_45d[0] = '-';
        index = -index;
        uVar7 = 2;
      }
      else {
        uVar7 = 1;
        pcVar9 = local_45d;
      }
      iVar10 = 1000000000;
      bVar2 = 0;
      do {
        bVar11 = (int)((long)(int)index / (long)iVar10) != 0;
        bVar12 = iVar10 == 1;
        if ((bool)(bVar2 | bVar12 | bVar11)) {
          pcVar1 = pcVar9 + 1;
          *pcVar9 = (char)((long)(int)index / (long)iVar10) + '0';
          pcVar9 = pcVar1;
          if (iVar10 == 1) break;
          uVar7 = uVar7 + 1;
          index = (int)index % iVar10;
        }
        iVar10 = iVar10 / 10;
        bVar2 = bVar2 | bVar12 | bVar11;
      } while (uVar7 < 0xd);
      *pcVar9 = '\0';
      local_450[0] = local_440;
      sVar5 = strlen(local_45d);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_450,local_45d,local_45d + sVar5);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_450,0,(char *)0x0,0x6ac8c1);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar8) {
        lVar3 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_450[0] != local_440) {
        operator_delete(local_450[0],local_440[0] + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ObjExporter::GetMaterialName(unsigned int index) {
    const aiMaterial* const mat = pScene->mMaterials[index];
    if ( nullptr == mat ) {
        static const std::string EmptyStr;
        return EmptyStr;
    }

    aiString s;
    if(AI_SUCCESS == mat->Get(AI_MATKEY_NAME,s)) {
        return std::string(s.data,s.length);
    }

    char number[ sizeof(unsigned int) * 3 + 1 ];
    ASSIMP_itoa10(number,index);
    return "$Material_" + std::string(number);
}